

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  deUint32 err;
  uint err_00;
  deBool dVar1;
  MessageBuilder *pMVar2;
  GLint *extraout_RDX;
  GLint *extraout_RDX_00;
  GLint *pGVar3;
  GLint *extraout_RDX_01;
  GLdouble *pGVar4;
  GLenum GVar5;
  Enum<int,_2UL> EVar6;
  MessageBuilder local_1f68;
  undefined4 local_1de4;
  GetNameFunc local_1de0;
  int local_1dd8;
  Enum<int,_2UL> local_1dd0;
  MessageBuilder local_1dc0;
  undefined1 local_1c3c [8];
  GLint reset;
  Functions gl;
  undefined1 local_208 [8];
  RenderingContext context;
  EGLint attribList [9];
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  LoseContextOnResetCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [100])
                      "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  context.m_context = (EGLContext)0x300003098;
  RobustnessTestCase::checkRequiredEGLExtensions
            (&this->super_RobustnessTestCase,(EGLint *)&context.m_context);
  gl.waitSync = (glWaitSyncFunc)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_208,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,
             (EGLint *)&context.m_context,&(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.waitSync);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_208,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)(local_1c3c + 4));
  RenderingContext::initGLFunctions((RenderingContext *)local_208,(Functions *)(local_1c3c + 4));
  checkRequiredGLRobustnessExtension((EGLint *)&context.m_context,(Functions *)(local_1c3c + 4));
  local_1c3c._0_4_ = 0;
  GVar5 = 0x8256;
  pGVar4 = (GLdouble *)local_1c3c;
  (*gl.getIntegeri_v)(0x8256,(GLuint)pGVar4,extraout_RDX);
  err = (*gl.getDoublev)(GVar5,pGVar4);
  glu::checkError(err,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5f6);
  if (local_1c3c._0_4_ == 0x8252) {
    tcu::TestLog::operator<<(&local_1f68,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1f68,
                        (char (*) [72])
                        "Check the graphics reset status returned by glGetGraphicsResetStatus() ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [20])"equals GL_NO_ERROR\n");
    pGVar4 = (GLdouble *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    pMVar2 = &local_1f68;
    tcu::MessageBuilder::~MessageBuilder(pMVar2);
    pGVar3 = extraout_RDX_00;
    do {
      GVar5 = (GLenum)pMVar2;
      (*gl.getFramebufferParameteriv)(GVar5,(GLenum)pGVar4,pGVar3);
      err_00 = (*gl.getDoublev)(GVar5,pGVar4);
      pMVar2 = (MessageBuilder *)(ulong)err_00;
      pGVar4 = (GLdouble *)0x2b4766e;
      glu::checkError(err_00,"getGraphicsResetStatus()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x607);
      dVar1 = ::deGetFalse();
      pGVar3 = extraout_RDX_01;
    } while (dVar1 != 0);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_1dc0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1dc0,
                        (char (*) [53])"Test failed! glGetIntegerv() returned wrong value. [");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)local_1c3c);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [12])0x2c16365);
    EVar6 = glu::getErrorStr(0x8252);
    local_1de0 = EVar6.m_getName;
    local_1dd8 = EVar6.m_value;
    local_1dd0.m_getName = local_1de0;
    local_1dd0.m_value = local_1dd8;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1dd0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1dc0);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  this_local._4_4_ = STOP;
  local_1de4 = 1;
  RenderingContext::~RenderingContext((RenderingContext *)local_208);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << reset << ", expected " << glu::getErrorStr(GL_LOSE_CONTEXT_ON_RESET) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		log << tcu::TestLog::Message
			<< "Check the graphics reset status returned by glGetGraphicsResetStatus() "
			<< "equals GL_NO_ERROR\n"
			<< tcu::TestLog::EndMessage;

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}